

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_time.h
# Opt level: O1

uint64_t stm_laptime(uint64_t *last_time)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  if (last_time != (uint64_t *)0x0) {
    uVar2 = stm_now();
    uVar1 = *last_time;
    *last_time = uVar2;
    uVar3 = 1;
    if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
      uVar3 = uVar2 - uVar1;
    }
    if (uVar1 == 0) {
      uVar3 = 0;
    }
    return uVar3;
  }
  __assert_fail("last_time",
                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/sokol/sokol_time.h"
                ,0x105,"uint64_t stm_laptime(uint64_t *)");
}

Assistant:

SOKOL_API_IMPL uint64_t stm_laptime(uint64_t* last_time) {
    SOKOL_ASSERT(last_time);
    uint64_t dt = 0;
    uint64_t now = stm_now();
    if (0 != *last_time) {
        dt = stm_diff(now, *last_time);
    }
    *last_time = now;
    return dt;
}